

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool Catch::list(IEventListener *reporter,Config *config)

{
  bool bVar1;
  Config *in_RSI;
  bool listed;
  IConfig *in_stack_00000018;
  IEventListener *in_stack_00000020;
  IEventListener *in_stack_00000090;
  IConfig *in_stack_000001b8;
  IEventListener *in_stack_000001c0;
  undefined1 local_11;
  
  local_11 = Config::listTests(in_RSI);
  if (local_11) {
    anon_unknown_26::listTests(in_stack_00000020,in_stack_00000018);
  }
  bVar1 = Config::listTags(in_RSI);
  if (bVar1) {
    local_11 = true;
    anon_unknown_26::listTags(in_stack_000001c0,in_stack_000001b8);
  }
  bVar1 = Config::listReporters(in_RSI);
  if (bVar1) {
    local_11 = true;
    anon_unknown_26::listReporters(in_stack_00000090);
  }
  bVar1 = Config::listListeners(in_RSI);
  if (bVar1) {
    local_11 = true;
    anon_unknown_26::listListeners(in_stack_00000090);
  }
  return local_11;
}

Assistant:

bool list( IEventListener& reporter, Config const& config ) {
        bool listed = false;
        if (config.listTests()) {
            listed = true;
            listTests(reporter, config);
        }
        if (config.listTags()) {
            listed = true;
            listTags(reporter, config);
        }
        if (config.listReporters()) {
            listed = true;
            listReporters(reporter);
        }
        if ( config.listListeners() ) {
            listed = true;
            listListeners( reporter );
        }
        return listed;
    }